

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalType *
duckdb::LogicalType::NormalizeType(LogicalType *__return_storage_ptr__,LogicalType *type)

{
  LogicalTypeId LVar1;
  ParameterNotResolvedException *this;
  
  LVar1 = type->id_;
  if (LVar1 == STRING_LITERAL) {
    LogicalType(__return_storage_ptr__,VARCHAR);
  }
  else if (LVar1 == INTEGER_LITERAL) {
    IntegerLiteral::GetType(__return_storage_ptr__,type);
  }
  else {
    if (LVar1 == UNKNOWN) {
      this = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this);
      __cxa_throw(this,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    LogicalType(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::NormalizeType(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::STRING_LITERAL:
		return LogicalType::VARCHAR;
	case LogicalTypeId::INTEGER_LITERAL:
		return IntegerLiteral::GetType(type);
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	default:
		return type;
	}
}